

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_read_format_rar.c
# Opt level: O2

void test_read_format_rar_multivolume_seek_data(void)

{
  int iVar1;
  wchar_t wVar2;
  mode_t mVar3;
  archive_conflict *a;
  char *pcVar4;
  time_t tVar5;
  la_int64_t lVar6;
  la_ssize_t lVar7;
  long lVar8;
  long lVar9;
  char *pcVar10;
  archive_entry *ae;
  char buff [64];
  char file_test_txt5 [65];
  char file_test_txt4 [65];
  char file_test_txt3 [65];
  char file_test_txt2 [65];
  char *reffiles [4];
  char file_test_txt1 [65];
  
  reffiles[2] = "test_rar_multivolume_single_file.part3.rar";
  reffiles[3] = (char *)0x0;
  reffiles[0] = "test_rar_multivolume_single_file.part1.rar";
  reffiles[1] = "test_rar_multivolume_single_file.part2.rar";
  lVar9 = 0x41;
  pcVar4 = "d. \n</P>\n<P STYLE=\"margin-bottom: 0in\"><BR>\n</P>\n</BODY>\n</HTML>";
  pcVar10 = file_test_txt1;
  for (lVar8 = lVar9; lVar8 != 0; lVar8 = lVar8 + -1) {
    *pcVar10 = *pcVar4;
    pcVar4 = pcVar4 + 1;
    pcVar10 = pcVar10 + 1;
  }
  pcVar4 = "<!DOCTYPE HTML PUBLIC \"-//W3C//DTD HTML 4.0 Transitional//EN\">\n<";
  pcVar10 = file_test_txt2;
  for (lVar8 = lVar9; lVar8 != 0; lVar8 = lVar8 + -1) {
    *pcVar10 = *pcVar4;
    pcVar4 = pcVar4 + 1;
    pcVar10 = pcVar10 + 1;
  }
  pcVar4 = "mplify writing such tests,\ntry to use platform-independent codin";
  pcVar10 = file_test_txt3;
  for (lVar8 = lVar9; lVar8 != 0; lVar8 = lVar8 + -1) {
    *pcVar10 = *pcVar4;
    pcVar4 = pcVar4 + 1;
    pcVar10 = pcVar10 + 1;
  }
  pcVar4 = "lString</TT> in the example above)\ngenerate detailed log message";
  pcVar10 = file_test_txt4;
  for (lVar8 = lVar9; lVar8 != 0; lVar8 = lVar8 + -1) {
    *pcVar10 = *pcVar4;
    pcVar4 = pcVar4 + 1;
    pcVar10 = pcVar10 + 1;
  }
  pcVar4 = "SS=\"western\">make check</TT> will usually run\n\tall of the tests.";
  pcVar10 = file_test_txt5;
  for (; lVar9 != 0; lVar9 = lVar9 + -1) {
    *pcVar10 = *pcVar4;
    pcVar4 = pcVar4 + 1;
    pcVar10 = pcVar10 + 1;
  }
  extract_reference_files(reffiles);
  a = (archive_conflict *)archive_read_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_rar.c"
                   ,L'՚',(uint)(a != (archive_conflict *)0x0),"(a = archive_read_new()) != NULL",
                   (void *)0x0);
  iVar1 = archive_read_support_filter_all((archive *)a);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_rar.c"
                   ,L'՛',(uint)(iVar1 == 0),"0 == archive_read_support_filter_all(a)",a);
  iVar1 = archive_read_support_format_all((archive *)a);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_rar.c"
                   ,L'՜',(uint)(iVar1 == 0),"0 == archive_read_support_format_all(a)",a);
  wVar2 = archive_read_open_filenames(a,reffiles,0x2800);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_rar.c"
                   ,L'՝',(uint)(wVar2 == L'\0'),
                   "0 == archive_read_open_filenames(a, reffiles, 10240)",a);
  iVar1 = archive_read_next_header((archive *)a,&ae);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_rar.c"
                   ,L'ՠ',(uint)(iVar1 == 0),"0 == archive_read_next_header(a, &ae)",a);
  pcVar4 = archive_entry_pathname(ae);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_rar.c"
             ,L'ա',"LibarchiveAddingTest.html","\"LibarchiveAddingTest.html\"",pcVar4,
             "archive_entry_pathname(ae)",(void *)0x0,L'\0');
  tVar5 = archive_entry_mtime(ae);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_rar.c"
                   ,L'բ',(wchar_t)tVar5,"(int)archive_entry_mtime(ae)",a);
  tVar5 = archive_entry_ctime(ae);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_rar.c"
                   ,L'գ',(wchar_t)tVar5,"(int)archive_entry_ctime(ae)",a);
  tVar5 = archive_entry_atime(ae);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_rar.c"
                   ,L'դ',(wchar_t)tVar5,"(int)archive_entry_atime(ae)",a);
  lVar6 = archive_entry_size(ae);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_rar.c"
                      ,L'ե',0x4e8f,"file_size",lVar6,"archive_entry_size(ae)",(void *)0x0);
  mVar3 = archive_entry_mode(ae);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_rar.c"
                      ,L'զ',0x81a4,"33188",(ulong)mVar3,"archive_entry_mode(ae)",(void *)0x0);
  wVar2 = archive_entry_is_encrypted(ae);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_rar.c"
                      ,L'է',(long)wVar2,"archive_entry_is_encrypted(ae)",0,"0",(void *)0x0);
  iVar1 = archive_read_has_encrypted_entries((archive *)a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_rar.c"
                      ,L'ը',(long)iVar1,"archive_read_has_encrypted_entries(a)",0,"0",a);
  lVar6 = archive_seek_data((archive *)a,0x4e4f,0);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_rar.c"
                   ,L'լ',(uint)(lVar6 == 0x4e4f),
                   "file_size - (int)sizeof(buff) == archive_seek_data(a, file_size - (int)sizeof(buff), SEEK_SET)"
                   ,a);
  lVar7 = archive_read_data((archive *)a,buff,0x40);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_rar.c"
                   ,L'խ',(uint)(lVar7 == 0x40),
                   "sizeof(buff) == archive_read_data(a, buff, sizeof(buff))",a);
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_rar.c"
                      ,L'ծ',buff,"buff",file_test_txt1,"file_test_txt1",0x40,
                      "sizeof(file_test_txt1) - 1",(void *)0x0);
  lVar6 = archive_seek_data((archive *)a,0,0);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_rar.c"
                   ,L'ձ',(uint)(lVar6 == 0),"0 == archive_seek_data(a, 0, SEEK_SET)",a);
  lVar7 = archive_read_data((archive *)a,buff,0x40);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_rar.c"
                   ,L'ղ',(uint)(lVar7 == 0x40),
                   "sizeof(buff) == archive_read_data(a, buff, sizeof(buff))",a);
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_rar.c"
                      ,L'ճ',buff,"buff",file_test_txt2,"file_test_txt2",0x40,
                      "sizeof(file_test_txt2) - 1",(void *)0x0);
  lVar6 = archive_seek_data((archive *)a,0x2746,0);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_rar.c"
                   ,L'ն',(uint)(lVar6 == 0x2746),"10054 == archive_seek_data(a, 10054, SEEK_SET)",a
                  );
  lVar7 = archive_read_data((archive *)a,buff,0x40);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_rar.c"
                   ,L'շ',(uint)(lVar7 == 0x40),
                   "sizeof(buff) == archive_read_data(a, buff, sizeof(buff))",a);
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_rar.c"
                      ,L'ո',buff,"buff",file_test_txt3,"file_test_txt3",0x40,
                      "sizeof(file_test_txt3) - 1",(void *)0x0);
  lVar6 = archive_seek_data((archive *)a,0x1acc,0);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_rar.c"
                   ,L'ջ',(uint)(lVar6 == 0x1acc),"6860 == archive_seek_data(a, 6860, SEEK_SET)",a);
  lVar7 = archive_read_data((archive *)a,buff,0x40);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_rar.c"
                   ,L'ռ',(uint)(lVar7 == 0x40),
                   "sizeof(buff) == archive_read_data(a, buff, sizeof(buff))",a);
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_rar.c"
                      ,L'ս',buff,"buff",file_test_txt4,"file_test_txt4",0x40,
                      "sizeof(file_test_txt4) - 1",(void *)0x0);
  lVar6 = archive_seek_data((archive *)a,0x35b8,0);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_rar.c"
                   ,L'ր',(uint)(lVar6 == 0x35b8),"13752 == archive_seek_data(a, 13752, SEEK_SET)",a
                  );
  lVar7 = archive_read_data((archive *)a,buff,0x40);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_rar.c"
                   ,L'ց',(uint)(lVar7 == 0x40),
                   "sizeof(buff) == archive_read_data(a, buff, sizeof(buff))",a);
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_rar.c"
                      ,L'ւ',buff,"buff",file_test_txt5,"file_test_txt5",0x40,
                      "sizeof(file_test_txt5) - 1",(void *)0x0);
  lVar6 = archive_seek_data((archive *)a,0,2);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_rar.c"
                      ,L'օ',0x4e8f,"file_size",lVar6,"archive_seek_data(a, 0, SEEK_END)",
                      (void *)0x0);
  lVar6 = archive_seek_data((archive *)a,0,0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_rar.c"
                      ,L'ֆ',0,"0",lVar6,"archive_seek_data(a, 0, SEEK_SET)",(void *)0x0);
  lVar6 = archive_seek_data((archive *)a,0,1);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_rar.c"
                      ,L'և',0,"0",lVar6,"archive_seek_data(a, 0, SEEK_CUR)",(void *)0x0);
  lVar6 = archive_seek_data((archive *)a,-10,1);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_rar.c"
                      ,L'ֈ',-1,"-1",lVar6,"archive_seek_data(a, -10, SEEK_CUR)",(void *)0x0);
  lVar6 = archive_seek_data((archive *)a,10,1);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_rar.c"
                      ,L'։',10,"10",lVar6,"archive_seek_data(a, 10, SEEK_CUR)",(void *)0x0);
  lVar6 = archive_seek_data((archive *)a,-0x14,1);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_rar.c"
                      ,L'֊',-1,"-1",lVar6,"archive_seek_data(a, -20, SEEK_CUR)",(void *)0x0);
  lVar6 = archive_seek_data((archive *)a,0,1);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_rar.c"
                      ,L'֋',10,"10",lVar6,"archive_seek_data(a, 0, SEEK_CUR)",(void *)0x0);
  lVar6 = archive_seek_data((archive *)a,0,2);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_rar.c"
                      ,L'֌',0x4e8f,"file_size",lVar6,"archive_seek_data(a, 0, SEEK_END)",
                      (void *)0x0);
  lVar6 = archive_seek_data((archive *)a,-0x14,2);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_rar.c"
                      ,L'֍',0x4e7b,"file_size - 20",lVar6,"archive_seek_data(a, -20, SEEK_END)",
                      (void *)0x0);
  lVar6 = archive_seek_data((archive *)a,0x28,2);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_rar.c"
                      ,L'֎',0x4eb7,"file_size + 40",lVar6,"archive_seek_data(a, 40, SEEK_END)",
                      (void *)0x0);
  lVar6 = archive_seek_data((archive *)a,0,1);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_rar.c"
                      ,L'֏',0x4eb7,"file_size + 40",lVar6,"archive_seek_data(a, 0, SEEK_CUR)",
                      (void *)0x0);
  lVar6 = archive_seek_data((archive *)a,0x14,1);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_rar.c"
                      ,L'֐',0x4ecb,"file_size + 40 + 20",lVar6,"archive_seek_data(a, 20, SEEK_CUR)"
                      ,(void *)0x0);
  lVar6 = archive_seek_data((archive *)a,0x14,1);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_rar.c"
                      ,L'֑',0x4edf,"file_size + 40 + 20 + 20",lVar6,
                      "archive_seek_data(a, 20, SEEK_CUR)",(void *)0x0);
  lVar6 = archive_seek_data((archive *)a,0x14,2);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_rar.c"
                      ,L'֒',0x4ea3,"file_size + 20",lVar6,"archive_seek_data(a, 20, SEEK_END)",
                      (void *)0x0);
  lVar6 = archive_seek_data((archive *)a,-0x14,2);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_rar.c"
                      ,L'֓',0x4e7b,"file_size - 20",lVar6,"archive_seek_data(a, -20, SEEK_END)",
                      (void *)0x0);
  lVar6 = archive_seek_data((archive *)a,0,2);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_rar.c"
                      ,L'֙',0x4e8f,"file_size",lVar6,"archive_seek_data(a, 0, SEEK_END)",
                      (void *)0x0);
  lVar7 = archive_read_data((archive *)a,buff,0x40);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_rar.c"
                   ,L'֚',(uint)(lVar7 == 0),"0 == archive_read_data(a, buff, sizeof(buff))",a);
  lVar6 = archive_seek_data((archive *)a,0x28,1);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_rar.c"
                      ,L'֛',0x4eb7,"file_size + 40",lVar6,"archive_seek_data(a, 40, SEEK_CUR)",
                      (void *)0x0);
  lVar7 = archive_read_data((archive *)a,buff,0x40);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_rar.c"
                   ,L'֜',(uint)(lVar7 == 0),"0 == archive_read_data(a, buff, sizeof(buff))",a);
  lVar6 = archive_seek_data((archive *)a,0,0);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_rar.c"
                   ,L'֟',(uint)(lVar6 == 0),"0 == archive_seek_data(a, 0, SEEK_SET)",a);
  lVar6 = archive_seek_data((archive *)a,-0x40,2);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_rar.c"
                   ,L'֡',(uint)(lVar6 == 0x4e4f),
                   "file_size - (int)sizeof(buff) == archive_seek_data(a, -(int)sizeof(buff), SEEK_END)"
                   ,a);
  lVar7 = archive_read_data((archive *)a,buff,0x40);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_rar.c"
                   ,L'֢',(uint)(lVar7 == 0x40),
                   "sizeof(buff) == archive_read_data(a, buff, sizeof(buff))",a);
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_rar.c"
                      ,L'֣',buff,"buff",file_test_txt1,"file_test_txt1",0x40,
                      "sizeof(file_test_txt1) - 1",(void *)0x0);
  lVar6 = archive_seek_data((archive *)a,0,1);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_rar.c"
                   ,L'֦',(uint)(lVar6 == 0x4e8f),"file_size == archive_seek_data(a, 0, SEEK_CUR)",a
                  );
  lVar6 = archive_seek_data((archive *)a,-0x4e8f,1);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_rar.c"
                   ,L'֩',(uint)(lVar6 == 0),"0 == archive_seek_data(a, -file_size, SEEK_CUR)",a);
  lVar7 = archive_read_data((archive *)a,buff,0x40);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_rar.c"
                   ,L'֪',(uint)(lVar7 == 0x40),
                   "sizeof(buff) == archive_read_data(a, buff, sizeof(buff))",a);
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_rar.c"
                      ,L'֫',buff,"buff",file_test_txt2,"file_test_txt2",0x40,
                      "sizeof(file_test_txt2) - 1",(void *)0x0);
  lVar6 = archive_seek_data((archive *)a,0x2706,1);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_rar.c"
                   ,L'֮',(uint)(lVar6 == 0x2746),
                   "10054 == archive_seek_data(a, 10054 - (int)sizeof(buff), SEEK_CUR)",a);
  lVar7 = archive_read_data((archive *)a,buff,0x40);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_rar.c"
                   ,L'֯',(uint)(lVar7 == 0x40),
                   "sizeof(buff) == archive_read_data(a, buff, sizeof(buff))",a);
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_rar.c"
                      ,L'ְ',buff,"buff",file_test_txt3,"file_test_txt3",0x40,
                      "sizeof(file_test_txt3) - 1",(void *)0x0);
  lVar6 = archive_seek_data((archive *)a,-0xcba,1);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_rar.c"
                   ,L'ִ',(uint)(lVar6 == 0x1acc),
                   "6860 == archive_seek_data(a, 6860 - (10054 + (int)sizeof(buff)), SEEK_CUR)",a);
  lVar7 = archive_read_data((archive *)a,buff,0x40);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_rar.c"
                   ,L'ֵ',(uint)(lVar7 == 0x40),
                   "sizeof(buff) == archive_read_data(a, buff, sizeof(buff))",a);
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_rar.c"
                      ,L'ֶ',buff,"buff",file_test_txt4,"file_test_txt4",0x40,
                      "sizeof(file_test_txt4) - 1",(void *)0x0);
  lVar6 = archive_seek_data((archive *)a,-0x18d7,2);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_rar.c"
                   ,L'ֹ',(uint)(lVar6 == 0x35b8),
                   "13752 == archive_seek_data(a, 13752 - file_size, SEEK_END)",a);
  lVar7 = archive_read_data((archive *)a,buff,0x40);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_rar.c"
                   ,L'ֺ',(uint)(lVar7 == 0x40),
                   "sizeof(buff) == archive_read_data(a, buff, sizeof(buff))",a);
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_rar.c"
                      ,L'ֻ',buff,"buff",file_test_txt5,"file_test_txt5",0x40,
                      "sizeof(file_test_txt5) - 1",(void *)0x0);
  iVar1 = archive_read_next_header((archive *)a,&ae);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_rar.c"
                   ,L'־',(uint)(iVar1 == 1),"1 == archive_read_next_header(a, &ae)",a);
  iVar1 = archive_file_count((archive *)a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_rar.c"
                      ,L'ֿ',1,"1",(long)iVar1,"archive_file_count(a)",(void *)0x0);
  iVar1 = archive_read_close((archive *)a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_rar.c"
                      ,L'׀',0,"ARCHIVE_OK",(long)iVar1,"archive_read_close(a)",a);
  iVar1 = archive_read_free((archive *)a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_rar.c"
                      ,L'ׁ',0,"ARCHIVE_OK",(long)iVar1,"archive_read_free(a)",(void *)0x0);
  return;
}

Assistant:

DEFINE_TEST(test_read_format_rar_multivolume_seek_data)
{
  const char *reffiles[] =
  {
    "test_rar_multivolume_single_file.part1.rar",
    "test_rar_multivolume_single_file.part2.rar",
    "test_rar_multivolume_single_file.part3.rar",
    NULL
  };
  char buff[64];
  int file_size = 20111;
  const char file_test_txt1[] = "d. \n</P>\n<P STYLE=\"margin-bottom: 0in\">"
                                "<BR>\n</P>\n</BODY>\n</HTML>";
  const char file_test_txt2[] = "<!DOCTYPE HTML PUBLIC \"-//W3C//DTD HTML 4."
                                "0 Transitional//EN\">\n<";
  const char file_test_txt3[] = "mplify writing such tests,\ntry to use plat"
                                "form-independent codin";
  const char file_test_txt4[] = "lString</TT> in the example above)\ngenerat"
                                "e detailed log message";
  const char file_test_txt5[] = "SS=\"western\">make check</TT> will usually"
                                " run\n\tall of the tests.";
  struct archive_entry *ae;
  struct archive *a;

  extract_reference_files(reffiles);
  assert((a = archive_read_new()) != NULL);
  assertA(0 == archive_read_support_filter_all(a));
  assertA(0 == archive_read_support_format_all(a));
  assertA(0 == archive_read_open_filenames(a, reffiles, 10240));

  /* First header. */
  assertA(0 == archive_read_next_header(a, &ae));
  assertEqualString("LibarchiveAddingTest.html", archive_entry_pathname(ae));
  assertA((int)archive_entry_mtime(ae));
  assertA((int)archive_entry_ctime(ae));
  assertA((int)archive_entry_atime(ae));
  assertEqualInt(file_size, archive_entry_size(ae));
  assertEqualInt(33188, archive_entry_mode(ae));
  assertEqualInt(archive_entry_is_encrypted(ae), 0);
  assertEqualIntA(a, archive_read_has_encrypted_entries(a), 0);

  /* Seek to the end minus 64 bytes */
  assertA(file_size - (int)sizeof(buff) ==
    archive_seek_data(a, file_size - (int)sizeof(buff), SEEK_SET));
  assertA(sizeof(buff) == archive_read_data(a, buff, sizeof(buff)));
  assertEqualMem(buff, file_test_txt1, sizeof(file_test_txt1) - 1);

  /* Seek back to the beginning */
  assertA(0 == archive_seek_data(a, 0, SEEK_SET));
  assertA(sizeof(buff) == archive_read_data(a, buff, sizeof(buff)));
  assertEqualMem(buff, file_test_txt2, sizeof(file_test_txt2) - 1);

  /* Seek to the middle of the combined data block */
  assertA(10054 == archive_seek_data(a, 10054, SEEK_SET));
  assertA(sizeof(buff) == archive_read_data(a, buff, sizeof(buff)));
  assertEqualMem(buff, file_test_txt3, sizeof(file_test_txt3) - 1);

  /* Seek to 32 bytes before the end of the first data sub-block */
  assertA(6860 == archive_seek_data(a, 6860, SEEK_SET));
  assertA(sizeof(buff) == archive_read_data(a, buff, sizeof(buff)));
  assertEqualMem(buff, file_test_txt4, sizeof(file_test_txt4) - 1);

  /* Seek to 32 bytes before the end of the second data sub-block */
  assertA(13752 == archive_seek_data(a, 13752, SEEK_SET));
  assertA(sizeof(buff) == archive_read_data(a, buff, sizeof(buff)));
  assertEqualMem(buff, file_test_txt5, sizeof(file_test_txt5) - 1);

  /* Use various combinations of SEEK_SET, SEEK_CUR, and SEEK_END */
  assertEqualInt(file_size, archive_seek_data(a, 0, SEEK_END));
  assertEqualInt(0, archive_seek_data(a, 0, SEEK_SET));
  assertEqualInt(0, archive_seek_data(a, 0, SEEK_CUR));
  assertEqualInt(-1, archive_seek_data(a, -10, SEEK_CUR));
  assertEqualInt(10, archive_seek_data(a, 10, SEEK_CUR));
  assertEqualInt(-1, archive_seek_data(a, -20, SEEK_CUR));
  assertEqualInt(10, archive_seek_data(a, 0, SEEK_CUR));
  assertEqualInt(file_size, archive_seek_data(a, 0, SEEK_END));
  assertEqualInt(file_size - 20, archive_seek_data(a, -20, SEEK_END));
  assertEqualInt(file_size + 40, archive_seek_data(a, 40, SEEK_END));
  assertEqualInt(file_size + 40, archive_seek_data(a, 0, SEEK_CUR));
  assertEqualInt(file_size + 40 + 20, archive_seek_data(a, 20, SEEK_CUR));
  assertEqualInt(file_size + 40 + 20 + 20, archive_seek_data(a, 20, SEEK_CUR));
  assertEqualInt(file_size + 20, archive_seek_data(a, 20, SEEK_END));
  assertEqualInt(file_size - 20, archive_seek_data(a, -20, SEEK_END));

  /*
   * Attempt to read from the end of the file. These should return
   * 0 for end of file.
   */
  assertEqualInt(file_size, archive_seek_data(a, 0, SEEK_END));
  assertA(0 == archive_read_data(a, buff, sizeof(buff)));
  assertEqualInt(file_size + 40, archive_seek_data(a, 40, SEEK_CUR));
  assertA(0 == archive_read_data(a, buff, sizeof(buff)));

  /* Seek to the end minus 64 bytes */
  assertA(0 == archive_seek_data(a, 0, SEEK_SET));
  assertA(file_size - (int)sizeof(buff) ==
    archive_seek_data(a, -(int)sizeof(buff), SEEK_END));
  assertA(sizeof(buff) == archive_read_data(a, buff, sizeof(buff)));
  assertEqualMem(buff, file_test_txt1, sizeof(file_test_txt1) - 1);

  /* The file position should be at the end of the file here */
  assertA(file_size == archive_seek_data(a, 0, SEEK_CUR));

  /* Seek back to the beginning */
  assertA(0 == archive_seek_data(a, -file_size, SEEK_CUR));
  assertA(sizeof(buff) == archive_read_data(a, buff, sizeof(buff)));
  assertEqualMem(buff, file_test_txt2, sizeof(file_test_txt2) - 1);

  /* Seek to the middle of the combined data block */
  assertA(10054 == archive_seek_data(a, 10054 - (int)sizeof(buff), SEEK_CUR));
  assertA(sizeof(buff) == archive_read_data(a, buff, sizeof(buff)));
  assertEqualMem(buff, file_test_txt3, sizeof(file_test_txt3) - 1);

  /* Seek to 32 bytes before the end of the first data sub-block */
  assertA(6860 == archive_seek_data(a, 6860 - (10054 + (int)sizeof(buff)),
                                    SEEK_CUR));
  assertA(sizeof(buff) == archive_read_data(a, buff, sizeof(buff)));
  assertEqualMem(buff, file_test_txt4, sizeof(file_test_txt4) - 1);

  /* Seek to 32 bytes before the end of the second data sub-block */
  assertA(13752 == archive_seek_data(a, 13752 - file_size, SEEK_END));
  assertA(sizeof(buff) == archive_read_data(a, buff, sizeof(buff)));
  assertEqualMem(buff, file_test_txt5, sizeof(file_test_txt5) - 1);

  /* Test EOF */
  assertA(1 == archive_read_next_header(a, &ae));
  assertEqualInt(1, archive_file_count(a));
  assertEqualIntA(a, ARCHIVE_OK, archive_read_close(a));
  assertEqualInt(ARCHIVE_OK, archive_read_free(a));
}